

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O1

void Abc_IsopTestNew(void)

{
  word in_RAX;
  Vec_Int_t *vCover;
  int *pCover;
  word wVar1;
  int iVar2;
  word r;
  word local_28;
  
  local_28 = in_RAX;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 1000;
  vCover->nSize = 0;
  pCover = (int *)malloc(4000);
  vCover->pArray = pCover;
  wVar1 = Abc_Esop6Cover(0x7888788878887888,4,0xffff00000000,pCover);
  iVar2 = (int)(wVar1 >> 0x20);
  vCover->nSize = iVar2;
  if (iVar2 < 0x3e9) {
    printf("Cubes = %d.  Lits = %d.\n",wVar1 >> 0x20,wVar1 & 0xffffffff);
    Abc_IsopPrintCover(vCover,4,0);
    Abc_IsopBuildTruth(vCover,4,&local_28,1,0);
    if (local_28 != 0x7888788878887888) {
      puts("Verification failed.");
    }
    if (pCover != (int *)0x0) {
      free(pCover);
      vCover->pArray = (int *)0x0;
    }
    free(vCover);
    return;
  }
  __assert_fail("vCover->nSize <= vCover->nCap",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                ,0x3ec,"void Abc_IsopTestNew()");
}

Assistant:

void Abc_IsopTestNew()
{
    int nVars = 4;
    Vec_Int_t * vCover = Vec_IntAlloc( 1000 );
    word r, t = (s_Truths6[0] & s_Truths6[1]) ^ (s_Truths6[2] & s_Truths6[3]), copy = t;
//    word r, t = ~s_Truths6[0] | (s_Truths6[1] & s_Truths6[2] & s_Truths6[3]), copy = t;
//    word r, t = 0xABCDABCDABCDABCD, copy = t;
//    word r, t = 0x6996000000006996, copy = t;
//    word Cost = Abc_IsopNew( &t, &t, &r, nVars, Abc_Cube2Cost(ABC_ISOP_MAX_CUBE), Vec_IntArray(vCover) );
    word Cost = Abc_EsopCheck( &t, nVars, Abc_Cube2Cost(ABC_ISOP_MAX_CUBE), Vec_IntArray(vCover) );
    vCover->nSize = Abc_CostCubes(Cost);
    assert( vCover->nSize <= vCover->nCap );
    printf( "Cubes = %d.  Lits = %d.\n", Abc_CostCubes(Cost), Abc_CostLits(Cost) );
    Abc_IsopPrintCover( vCover, nVars, 0 );
    Abc_IsopVerify( &copy, nVars, &r, vCover, 1, 0 );
    Vec_IntFree( vCover );
}